

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_evfsctuf(CPUPPCState_conflict *env,uint64_t val)

{
  int iVar1;
  float32 b;
  float32 fVar2;
  uint32_t uVar3;
  uint uVar4;
  float_status *status;
  ulong uVar5;
  
  status = &env->vec_status;
  fVar2 = (float32)(val >> 0x20);
  iVar1 = float32_is_quiet_nan_ppc(fVar2,status);
  if (iVar1 == 0) {
    b = uint64_to_float32_ppc(0x100000000,status);
    fVar2 = float32_mul_ppc(fVar2,b,status);
    uVar3 = float32_to_uint32_ppc(fVar2,status);
    uVar5 = (ulong)uVar3 << 0x20;
  }
  else {
    uVar5 = 0;
  }
  iVar1 = float32_is_quiet_nan_ppc((float32)val,status);
  if (iVar1 == 0) {
    fVar2 = uint64_to_float32_ppc(0x100000000,status);
    fVar2 = float32_mul_ppc((float32)val,fVar2,status);
    uVar4 = float32_to_uint32_ppc(fVar2,status);
  }
  else {
    uVar4 = 0;
  }
  return uVar4 | uVar5;
}

Assistant:

static inline uint32_t efsadd(CPUPPCState *env, uint32_t op1, uint32_t op2)
{
    CPU_FloatU u1, u2;

    u1.l = op1;
    u2.l = op2;
    u1.f = float32_add(u1.f, u2.f, &env->vec_status);
    return u1.l;
}